

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O1

void duckdb::ListLengthFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  ulong count;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  bool bVar8;
  reference vector;
  TemplatedValidityData<unsigned_long> *pTVar9;
  ulong uVar10;
  data_ptr_t pdVar11;
  ulong uVar12;
  unsigned_long uVar13;
  data_ptr_t pdVar14;
  ulong uVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  buffer_ptr<ValidityBuffer> *local_90;
  DataChunk *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  local_88 = args;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar2 = result->data;
    pdVar11 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar3 == (unsigned_long *)0x0) {
      if (count != 0) {
        pdVar11 = pdVar11 + 8;
        uVar16 = 0;
        do {
          *(undefined8 *)(pdVar2 + uVar16 * 8) = *(undefined8 *)pdVar11;
          uVar16 = uVar16 + 1;
          pdVar11 = pdVar11 + 0x10;
        } while (count != uVar16);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar3;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar12 = 0;
        uVar16 = 0;
        do {
          if (puVar3 == (unsigned_long *)0x0) {
            uVar13 = 0xffffffffffffffff;
          }
          else {
            uVar13 = puVar3[uVar12];
          }
          uVar15 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar15 = count;
          }
          uVar10 = uVar15;
          if (uVar13 != 0) {
            uVar10 = uVar16;
            if (uVar13 == 0xffffffffffffffff) {
              if (uVar16 < uVar15) {
                pdVar14 = pdVar11 + uVar16 * 0x10 + 8;
                do {
                  *(undefined8 *)(pdVar2 + uVar10 * 8) = *(undefined8 *)pdVar14;
                  uVar10 = uVar10 + 1;
                  pdVar14 = pdVar14 + 0x10;
                } while (uVar15 != uVar10);
              }
            }
            else if (uVar16 < uVar15) {
              pdVar14 = pdVar11 + uVar16 * 0x10 + 8;
              uVar10 = 0;
              do {
                if ((uVar13 >> (uVar10 & 0x3f) & 1) != 0) {
                  *(undefined8 *)(pdVar2 + uVar10 * 8 + uVar16 * 8) = *(undefined8 *)pdVar14;
                }
                uVar10 = uVar10 + 1;
                pdVar14 = pdVar14 + 0x10;
              } while ((uVar16 - uVar15) + uVar10 != 0);
              uVar10 = uVar16 + uVar10;
            }
          }
          uVar12 = uVar12 + 1;
          uVar16 = uVar10;
        } while (uVar12 != count + 0x3f >> 6);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar2 = result->data;
    pdVar11 = vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      *(undefined8 *)pdVar2 = *(undefined8 *)(pdVar11 + 8);
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        uVar16 = 0;
        do {
          uVar12 = uVar16;
          if (psVar4 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar4[uVar16];
          }
          *(undefined8 *)(pdVar2 + uVar16 * 8) = *(undefined8 *)(local_78.data + uVar12 * 0x10 + 8);
          uVar16 = uVar16 + 1;
        } while (count != uVar16);
      }
    }
    else if (count != 0) {
      psVar4 = (local_78.sel)->sel_vector;
      local_90 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar16 = 0;
      do {
        uVar12 = uVar16;
        if (psVar4 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar4[uVar16];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar12 >> 6]
             >> (uVar12 & 0x3f) & 1) == 0) {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var7 = p_Stack_a0;
            peVar6 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (local_90);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar9->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar5 = (byte)uVar16 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar16 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        else {
          *(undefined8 *)(pdVar2 + uVar16 * 8) = *(undefined8 *)(local_78.data + uVar12 * 0x10 + 8);
        }
        uVar16 = uVar16 + 1;
      } while (count != uVar16);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  bVar8 = DataChunk::AllConstant(local_88);
  if (bVar8) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListLengthFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input = args.data[0];
	D_ASSERT(input.GetType().id() == LogicalTypeId::LIST);
	UnaryExecutor::Execute<list_entry_t, int64_t>(
	    input, result, args.size(), [](list_entry_t input) { return UnsafeNumericCast<int64_t>(input.length); });
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}